

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O2

void __thiscall Fn_CallReassign_Test::TestBody(Fn_CallReassign_Test *this)

{
  uint uVar1;
  AssertionResult *this_00;
  char *pcVar2;
  char *in_R9;
  bool bVar3;
  undefined1 local_178 [8];
  MockParser mock;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertionResult gtest_ar_;
  
  MockParser::MockParser
            ((MockParser *)local_178,"let a = 3let b = fn(a) {\n  let b = a\n}\na = b(4)");
  this_00 = &gtest_ar_;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  bVar3 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
  local_30.ptr_._0_4_ = CONCAT31(local_30.ptr_._1_3_,bVar3);
  if (bVar3) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
    uVar1 = *(uint *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
    local_30.ptr_._0_4_ = uVar1 & 0xff;
    gtest_ar_.message_.ptr_._0_4_ = 1;
    mock.cur_fn = mock.cur_fn + 1;
    testing::internal::CmpHelperEQ<BcOp,BcOp>
              ((internal *)local_50,"bc_op(ins)","BC_SET_N",(BcOp *)&local_30,
               (BcOp *)&gtest_ar_.message_);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_30);
      if (gtest_ar._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                 ,0x3f6,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      gtest_ar_.message_.ptr_._0_1_ = (char)(uVar1 >> 8);
      local_30.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<unsigned_char,int>
                ((internal *)local_50,"bc_arg1(ins)","0",(uchar *)&gtest_ar_.message_,
                 (int *)&local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x3f6,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar);
        gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x10);
        local_30.ptr_._0_4_ = 0;
        testing::internal::CmpHelperEQ<unsigned_short,int>
                  ((internal *)local_50,"bc_arg16(ins)","0",(unsigned_short *)&gtest_ar_.message_,
                   (int *)&local_30);
        if (local_50[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_30);
          if (gtest_ar._0_8_ == 0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                     ,0x3f6,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar);
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
          bVar3 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18)
          ;
          local_30.ptr_._0_4_ = CONCAT31(local_30.ptr_._1_3_,bVar3);
          if (!bVar3) {
            testing::Message::Message((Message *)&gtest_ar_.message_);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_50,(internal *)&local_30,
                       (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                       ,0x3f7,(char *)CONCAT71(local_50._1_7_,local_50[0]));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
            goto LAB_00151d72;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this_00);
          uVar1 = *(uint *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4)
          ;
          local_30.ptr_._0_4_ = uVar1 & 0xff;
          gtest_ar_.message_.ptr_._0_4_ = 3;
          mock.cur_fn = mock.cur_fn + 1;
          testing::internal::CmpHelperEQ<BcOp,BcOp>
                    ((internal *)local_50,"bc_op(ins)","BC_SET_F",(BcOp *)&local_30,
                     (BcOp *)&gtest_ar_.message_);
          if (local_50[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_30);
            if (gtest_ar._0_8_ == 0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                       ,0x3f7,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar);
            gtest_ar_.message_.ptr_._0_1_ = (char)(uVar1 >> 8);
            local_30.ptr_._0_4_ = 1;
            testing::internal::CmpHelperEQ<unsigned_char,int>
                      ((internal *)local_50,"bc_arg1(ins)","1",(uchar *)&gtest_ar_.message_,
                       (int *)&local_30);
            if (local_50[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_30);
              if (gtest_ar._0_8_ == 0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                         ,0x3f7,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar);
              gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x10);
              local_30.ptr_._0_4_ = 1;
              testing::internal::CmpHelperEQ<unsigned_short,int>
                        ((internal *)local_50,"bc_arg16(ins)","1",
                         (unsigned_short *)&gtest_ar_.message_,(int *)&local_30);
              if (local_50[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_30);
                if (gtest_ar._0_8_ == 0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = *(char **)gtest_ar._0_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                           ,0x3f7,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar);
                gtest_ar_.success_ = false;
                gtest_ar_._1_7_ = 0;
                bVar3 = mock.cur_fn <
                        (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
                local_30.ptr_._0_4_ = CONCAT31(local_30.ptr_._1_3_,bVar3);
                if (!bVar3) {
                  testing::Message::Message((Message *)&gtest_ar_.message_);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_50,(internal *)&local_30,
                             (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                             ,0x3f8,(char *)CONCAT71(local_50._1_7_,local_50[0]));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
                  goto LAB_00151d72;
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)this_00);
                uVar1 = *(uint *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) +
                                 mock.cur_fn * 4);
                local_30.ptr_._0_4_ = uVar1 & 0xff;
                gtest_ar_.message_.ptr_._0_4_ = 1;
                mock.cur_fn = mock.cur_fn + 1;
                testing::internal::CmpHelperEQ<BcOp,BcOp>
                          ((internal *)local_50,"bc_op(ins)","BC_SET_N",(BcOp *)&local_30,
                           (BcOp *)&gtest_ar_.message_);
                if (local_50[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_30);
                  if (gtest_ar._0_8_ == 0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = *(char **)gtest_ar._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                             ,0x3f8,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&gtest_ar);
                  gtest_ar_.message_.ptr_._0_1_ = (char)(uVar1 >> 8);
                  local_30.ptr_._0_4_ = 2;
                  testing::internal::CmpHelperEQ<unsigned_char,int>
                            ((internal *)local_50,"bc_arg1(ins)","2",(uchar *)&gtest_ar_.message_,
                             (int *)&local_30);
                  if (local_50[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_30);
                    if (gtest_ar._0_8_ == 0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = *(char **)gtest_ar._0_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                               ,0x3f8,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&gtest_ar);
                    gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x10);
                    local_30.ptr_._0_4_ = 1;
                    testing::internal::CmpHelperEQ<unsigned_short,int>
                              ((internal *)local_50,"bc_arg16(ins)","1",
                               (unsigned_short *)&gtest_ar_.message_,(int *)&local_30);
                    if (local_50[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&local_30);
                      if (gtest_ar._0_8_ == 0) {
                        pcVar2 = "";
                      }
                      else {
                        pcVar2 = *(char **)gtest_ar._0_8_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                 ,0x3f8,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                    }
                    else {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&gtest_ar);
                      gtest_ar_.success_ = false;
                      gtest_ar_._1_7_ = 0;
                      bVar3 = mock.cur_fn <
                              (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
                      local_30.ptr_._0_4_ = CONCAT31(local_30.ptr_._1_3_,bVar3);
                      if (!bVar3) {
                        testing::Message::Message((Message *)&gtest_ar_.message_);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_50,(internal *)&local_30,
                                   (AssertionResult *)
                                   "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                                   "true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                   ,0x3f9,(char *)CONCAT71(local_50._1_7_,local_50[0]));
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
                        goto LAB_00151d72;
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)this_00);
                      uVar1 = *(uint *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) +
                                       mock.cur_fn * 4);
                      local_30.ptr_._0_4_ = uVar1 & 0xff;
                      gtest_ar_.message_.ptr_._0_4_ = 0x1f;
                      mock.cur_fn = mock.cur_fn + 1;
                      testing::internal::CmpHelperEQ<BcOp,BcOp>
                                ((internal *)local_50,"bc_op(ins)","BC_CALL",(BcOp *)&local_30,
                                 (BcOp *)&gtest_ar_.message_);
                      if (local_50[0] == (internal)0x0) {
                        testing::Message::Message((Message *)&local_30);
                        if (gtest_ar._0_8_ == 0) {
                          pcVar2 = "";
                        }
                        else {
                          pcVar2 = *(char **)gtest_ar._0_8_;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                   ,0x3f9,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                      }
                      else {
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&gtest_ar);
                        gtest_ar_.message_.ptr_._0_1_ = (char)(uVar1 >> 8);
                        local_30.ptr_._0_4_ = 1;
                        testing::internal::CmpHelperEQ<unsigned_char,int>
                                  ((internal *)local_50,"bc_arg1(ins)","1",
                                   (uchar *)&gtest_ar_.message_,(int *)&local_30);
                        if (local_50[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&local_30);
                          if (gtest_ar._0_8_ == 0) {
                            pcVar2 = "";
                          }
                          else {
                            pcVar2 = *(char **)gtest_ar._0_8_;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                     ,0x3f9,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                        }
                        else {
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&gtest_ar);
                          gtest_ar_.message_.ptr_._0_1_ = (char)(uVar1 >> 0x10);
                          local_30.ptr_._0_4_ = 2;
                          testing::internal::CmpHelperEQ<unsigned_char,int>
                                    ((internal *)local_50,"bc_arg2(ins)","2",
                                     (uchar *)&gtest_ar_.message_,(int *)&local_30);
                          if (local_50[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_30);
                            if (gtest_ar._0_8_ == 0) {
                              pcVar2 = "";
                            }
                            else {
                              pcVar2 = *(char **)gtest_ar._0_8_;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                       ,0x3f9,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                          }
                          else {
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)&gtest_ar);
                            gtest_ar_.message_.ptr_._0_1_ = (char)(uVar1 >> 0x18);
                            local_30.ptr_._0_4_ = 1;
                            testing::internal::CmpHelperEQ<unsigned_char,int>
                                      ((internal *)local_50,"bc_arg3(ins)","1",
                                       (uchar *)&gtest_ar_.message_,(int *)&local_30);
                            if (local_50[0] == (internal)0x0) {
                              testing::Message::Message((Message *)&local_30);
                              if (gtest_ar._0_8_ == 0) {
                                pcVar2 = "";
                              }
                              else {
                                pcVar2 = *(char **)gtest_ar._0_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                         ,0x3f9,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                            }
                            else {
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)&gtest_ar);
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              bVar3 = mock.cur_fn <
                                      (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 +
                                                           mock.vm._264_8_ * 0x18);
                              local_30.ptr_._0_4_ = CONCAT31(local_30.ptr_._1_3_,bVar3);
                              if (!bVar3) {
                                testing::Message::Message((Message *)&gtest_ar_.message_);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_50,(internal *)&local_30,
                                           (AssertionResult *)
                                           "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count",
                                           "false","true",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                           ,0x3fa,(char *)CONCAT71(local_50._1_7_,local_50[0]));
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&mock.cur_ins,
                                           (Message *)&gtest_ar_.message_);
                                goto LAB_00151d72;
                              }
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)this_00);
                              uVar1 = *(uint *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18
                                                         ) + mock.cur_fn * 4);
                              local_30.ptr_._0_4_ = uVar1 & 0xff;
                              gtest_ar_.message_.ptr_._0_4_ = 0;
                              mock.cur_fn = mock.cur_fn + 1;
                              testing::internal::CmpHelperEQ<BcOp,BcOp>
                                        ((internal *)local_50,"bc_op(ins)","BC_MOV",
                                         (BcOp *)&local_30,(BcOp *)&gtest_ar_.message_);
                              if (local_50[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_30);
                                if (gtest_ar._0_8_ == 0) {
                                  pcVar2 = "";
                                }
                                else {
                                  pcVar2 = *(char **)gtest_ar._0_8_;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                           ,0x3fa,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30)
                                ;
                              }
                              else {
                                testing::internal::
                                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)&gtest_ar);
                                gtest_ar_.message_.ptr_._0_1_ = (char)(uVar1 >> 8);
                                local_30.ptr_._0_4_ = 0;
                                testing::internal::CmpHelperEQ<unsigned_char,int>
                                          ((internal *)local_50,"bc_arg1(ins)","0",
                                           (uchar *)&gtest_ar_.message_,(int *)&local_30);
                                if (local_50[0] == (internal)0x0) {
                                  testing::Message::Message((Message *)&local_30);
                                  if (gtest_ar._0_8_ == 0) {
                                    pcVar2 = "";
                                  }
                                  else {
                                    pcVar2 = *(char **)gtest_ar._0_8_;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                             ,0x3fa,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_30);
                                }
                                else {
                                  testing::internal::
                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                 *)&gtest_ar);
                                  gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x10);
                                  local_30.ptr_._0_4_ = 2;
                                  testing::internal::CmpHelperEQ<unsigned_short,int>
                                            ((internal *)local_50,"bc_arg16(ins)","2",
                                             (unsigned_short *)&gtest_ar_.message_,(int *)&local_30)
                                  ;
                                  if (local_50[0] == (internal)0x0) {
                                    testing::Message::Message((Message *)&local_30);
                                    if (gtest_ar._0_8_ == 0) {
                                      pcVar2 = "";
                                    }
                                    else {
                                      pcVar2 = *(char **)gtest_ar._0_8_;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                               ,0x3fa,pcVar2);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_.message_,
                                               (Message *)&local_30);
                                  }
                                  else {
                                    testing::internal::
                                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                    gtest_ar_.success_ = false;
                                    gtest_ar_._1_7_ = 0;
                                    bVar3 = mock.cur_fn <
                                            (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 +
                                                                 mock.vm._264_8_ * 0x18);
                                    local_30.ptr_._0_4_ = CONCAT31(local_30.ptr_._1_3_,bVar3);
                                    if (!bVar3) {
                                      testing::Message::Message((Message *)&gtest_ar_.message_);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                ((string *)local_50,(internal *)&local_30,
                                                 (AssertionResult *)
                                                 "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                 ,"false","true",in_R9);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                 ,0x3fb,(char *)CONCAT71(local_50._1_7_,local_50[0])
                                                );
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&mock.cur_ins,
                                                 (Message *)&gtest_ar_.message_);
                                      goto LAB_00151d72;
                                    }
                                    testing::internal::
                                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)this_00);
                                    uVar1 = *(uint *)(*(long *)(mock.vm._8_8_ + 8 +
                                                               mock.vm._264_8_ * 0x18) +
                                                     mock.cur_fn * 4);
                                    local_30.ptr_._0_4_ = uVar1 & 0xff;
                                    gtest_ar_.message_.ptr_._0_4_ = 0x20;
                                    mock.cur_fn = mock.cur_fn + 1;
                                    testing::internal::CmpHelperEQ<BcOp,BcOp>
                                              ((internal *)local_50,"bc_op(ins)","BC_RET",
                                               (BcOp *)&local_30,(BcOp *)&gtest_ar_.message_);
                                    if (local_50[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)&local_30);
                                      if (gtest_ar._0_8_ == 0) {
                                        pcVar2 = "";
                                      }
                                      else {
                                        pcVar2 = *(char **)gtest_ar._0_8_;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                 ,0x3fb,pcVar2);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_.message_,
                                                 (Message *)&local_30);
                                    }
                                    else {
                                      testing::internal::
                                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                      gtest_ar_.message_.ptr_._0_1_ = (char)(uVar1 >> 8);
                                      local_30.ptr_._0_4_ = 0;
                                      testing::internal::CmpHelperEQ<unsigned_char,int>
                                                ((internal *)local_50,"bc_arg1(ins)","0",
                                                 (uchar *)&gtest_ar_.message_,(int *)&local_30);
                                      if (local_50[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)&local_30);
                                        if (gtest_ar._0_8_ == 0) {
                                          pcVar2 = "";
                                        }
                                        else {
                                          pcVar2 = *(char **)gtest_ar._0_8_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure
                                                   ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3fb,pcVar2);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar_.message_,
                                                   (Message *)&local_30);
                                      }
                                      else {
                                        testing::internal::
                                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                        gtest_ar_.message_.ptr_._0_1_ = (char)(uVar1 >> 0x10);
                                        local_30.ptr_._0_4_ = 0;
                                        testing::internal::CmpHelperEQ<unsigned_char,int>
                                                  ((internal *)local_50,"bc_arg2(ins)","0",
                                                   (uchar *)&gtest_ar_.message_,(int *)&local_30);
                                        if (local_50[0] == (internal)0x0) {
                                          testing::Message::Message((Message *)&local_30);
                                          if (gtest_ar._0_8_ == 0) {
                                            pcVar2 = "";
                                          }
                                          else {
                                            pcVar2 = *(char **)gtest_ar._0_8_;
                                          }
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&gtest_ar_.message_,
                                                     kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3fb,pcVar2);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&gtest_ar_.message_,
                                                     (Message *)&local_30);
                                        }
                                        else {
                                          testing::internal::
                                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                          gtest_ar_.message_.ptr_._0_1_ = (char)(uVar1 >> 0x18);
                                          local_30.ptr_._0_4_ = 0;
                                          testing::internal::CmpHelperEQ<unsigned_char,int>
                                                    ((internal *)local_50,"bc_arg3(ins)","0",
                                                     (uchar *)&gtest_ar_.message_,(int *)&local_30);
                                          if (local_50[0] == (internal)0x0) {
                                            testing::Message::Message((Message *)&local_30);
                                            if (gtest_ar._0_8_ == 0) {
                                              pcVar2 = "";
                                            }
                                            else {
                                              pcVar2 = *(char **)gtest_ar._0_8_;
                                            }
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&gtest_ar_.message_,
                                                       kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3fb,pcVar2);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&gtest_ar_.message_,
                                                       (Message *)&local_30);
                                          }
                                          else {
                                            testing::internal::
                                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                            mock.cur_fn = 0;
                                            mock.vm.stack_size = 1;
                                            mock.vm._268_4_ = 0;
                                            gtest_ar_.success_ = false;
                                            gtest_ar_._1_7_ = 0;
                                            bVar3 = *(int *)(mock.vm._8_8_ + 0x28) == 0;
                                            local_30.ptr_._0_4_ =
                                                 CONCAT31(local_30.ptr_._1_3_,!bVar3);
                                            if (bVar3) {
                                              testing::Message::Message
                                                        ((Message *)&gtest_ar_.message_);
                                              testing::internal::
                                              GetBoolAssertionFailureMessage_abi_cxx11_
                                                        ((string *)local_50,(internal *)&local_30,
                                                         (AssertionResult *)
                                                                                                                  
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                              testing::internal::AssertHelper::AssertHelper
                                                        ((AssertHelper *)&mock.cur_ins,kFatalFailure
                                                         ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3fe,(char *)CONCAT71(local_50._1_7_,local_50[0]
                                                                         ));
                                              testing::internal::AssertHelper::operator=
                                                        ((AssertHelper *)&mock.cur_ins,
                                                         (Message *)&gtest_ar_.message_);
                                              goto LAB_00151d72;
                                            }
                                            testing::internal::
                                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)this_00);
                                            uVar1 = *(uint *)(*(long *)(mock.vm._8_8_ + 8 +
                                                                       mock.vm._264_8_ * 0x18) +
                                                             mock.cur_fn * 4);
                                            local_30.ptr_._0_4_ = uVar1 & 0xff;
                                            gtest_ar_.message_.ptr_._0_4_ = 0;
                                            mock.cur_fn = mock.cur_fn + 1;
                                            testing::internal::CmpHelperEQ<BcOp,BcOp>
                                                      ((internal *)local_50,"bc_op(ins)","BC_MOV",
                                                       (BcOp *)&local_30,(BcOp *)&gtest_ar_.message_
                                                      );
                                            if (local_50[0] == (internal)0x0) {
                                              testing::Message::Message((Message *)&local_30);
                                              if (gtest_ar._0_8_ == 0) {
                                                pcVar2 = "";
                                              }
                                              else {
                                                pcVar2 = *(char **)gtest_ar._0_8_;
                                              }
                                              testing::internal::AssertHelper::AssertHelper
                                                        ((AssertHelper *)&gtest_ar_.message_,
                                                         kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3fe,pcVar2);
                                              testing::internal::AssertHelper::operator=
                                                        ((AssertHelper *)&gtest_ar_.message_,
                                                         (Message *)&local_30);
                                            }
                                            else {
                                              testing::internal::
                                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                              gtest_ar_.message_.ptr_._0_1_ = (char)(uVar1 >> 8);
                                              local_30.ptr_._0_4_ = 1;
                                              testing::internal::CmpHelperEQ<unsigned_char,int>
                                                        ((internal *)local_50,"bc_arg1(ins)","1",
                                                         (uchar *)&gtest_ar_.message_,
                                                         (int *)&local_30);
                                              if (local_50[0] == (internal)0x0) {
                                                testing::Message::Message((Message *)&local_30);
                                                if (gtest_ar._0_8_ == 0) {
                                                  pcVar2 = "";
                                                }
                                                else {
                                                  pcVar2 = *(char **)gtest_ar._0_8_;
                                                }
                                                testing::internal::AssertHelper::AssertHelper
                                                          ((AssertHelper *)&gtest_ar_.message_,
                                                           kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3fe,pcVar2);
                                                testing::internal::AssertHelper::operator=
                                                          ((AssertHelper *)&gtest_ar_.message_,
                                                           (Message *)&local_30);
                                              }
                                              else {
                                                testing::internal::
                                                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                                gtest_ar_.message_.ptr_._0_2_ =
                                                     (short)(uVar1 >> 0x10);
                                                local_30.ptr_._0_4_ = 0;
                                                testing::internal::CmpHelperEQ<unsigned_short,int>
                                                          ((internal *)local_50,"bc_arg16(ins)","0",
                                                           (unsigned_short *)&gtest_ar_.message_,
                                                           (int *)&local_30);
                                                if (local_50[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_30);
                                                  if (gtest_ar._0_8_ == 0) {
                                                    pcVar2 = "";
                                                  }
                                                  else {
                                                    pcVar2 = *(char **)gtest_ar._0_8_;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3fe,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_30);
                                                }
                                                else {
                                                  testing::internal::
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  bVar3 = mock.cur_fn <
                                                          (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10
                                                                               + mock.vm._264_8_ *
                                                                                 0x18);
                                                  local_30.ptr_._0_4_ =
                                                       CONCAT31(local_30.ptr_._1_3_,bVar3);
                                                  if (!bVar3) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_50,
                                                               (internal *)&local_30,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&mock.cur_ins,
                                                             kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3ff,(char *)CONCAT71(local_50._1_7_,local_50[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&mock.cur_ins,
                                                             (Message *)&gtest_ar_.message_);
                                                  goto LAB_00151d72;
                                                  }
                                                  testing::internal::
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)this_00);
                                                  uVar1 = *(uint *)(*(long *)(mock.vm._8_8_ + 8 +
                                                                             mock.vm._264_8_ * 0x18)
                                                                   + mock.cur_fn * 4);
                                                  local_30.ptr_._0_4_ = uVar1 & 0xff;
                                                  gtest_ar_.message_.ptr_._0_4_ = 0x20;
                                                  mock.cur_fn = mock.cur_fn + 1;
                                                  testing::internal::CmpHelperEQ<BcOp,BcOp>
                                                            ((internal *)local_50,"bc_op(ins)",
                                                             "BC_RET",(BcOp *)&local_30,
                                                             (BcOp *)&gtest_ar_.message_);
                                                  if (local_50[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_30);
                                                    if (gtest_ar._0_8_ == 0) {
                                                      pcVar2 = "";
                                                    }
                                                    else {
                                                      pcVar2 = *(char **)gtest_ar._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3ff,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_30);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                                  gtest_ar_.message_.ptr_._0_1_ = (char)(uVar1 >> 8)
                                                  ;
                                                  local_30.ptr_._0_4_ = 0;
                                                  testing::internal::CmpHelperEQ<unsigned_char,int>
                                                            ((internal *)local_50,"bc_arg1(ins)","0"
                                                             ,(uchar *)&gtest_ar_.message_,
                                                             (int *)&local_30);
                                                  if (local_50[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_30);
                                                    if (gtest_ar._0_8_ == 0) {
                                                      pcVar2 = "";
                                                    }
                                                    else {
                                                      pcVar2 = *(char **)gtest_ar._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3ff,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_30);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                                  gtest_ar_.message_.ptr_._0_1_ =
                                                       (char)(uVar1 >> 0x10);
                                                  local_30.ptr_._0_4_ = 0;
                                                  testing::internal::CmpHelperEQ<unsigned_char,int>
                                                            ((internal *)local_50,"bc_arg2(ins)","0"
                                                             ,(uchar *)&gtest_ar_.message_,
                                                             (int *)&local_30);
                                                  if (local_50[0] != (internal)0x0) {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                                  gtest_ar_.message_.ptr_._0_1_ =
                                                       (char)(uVar1 >> 0x18);
                                                  local_30.ptr_._0_4_ = 0;
                                                  testing::internal::CmpHelperEQ<unsigned_char,int>
                                                            ((internal *)local_50,"bc_arg3(ins)","0"
                                                             ,(uchar *)&gtest_ar_.message_,
                                                             (int *)&local_30);
                                                  if (local_50[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_30);
                                                    if (gtest_ar._0_8_ == 0) {
                                                      pcVar2 = "";
                                                    }
                                                    else {
                                                      pcVar2 = *(char **)gtest_ar._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3ff,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_30);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  testing::internal::
                                                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&local_30);
                                                  }
                                                  this_00 = &gtest_ar;
                                                  goto LAB_00151ee1;
                                                  }
                                                  testing::Message::Message((Message *)&local_30);
                                                  if (gtest_ar._0_8_ == 0) {
                                                    pcVar2 = "";
                                                  }
                                                  else {
                                                    pcVar2 = *(char **)gtest_ar._0_8_;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x3ff,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_30);
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    this_00 = &gtest_ar;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)&local_30,
               (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mock.cur_ins,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x3f6,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
LAB_00151d72:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mock.cur_ins);
    std::__cxx11::string::~string((string *)local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_.message_);
  }
LAB_00151ee1:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this_00);
  MockParser::~MockParser((MockParser *)local_178);
  return;
}

Assistant:

TEST(Fn, CallReassign) {
	MockParser mock(
		"let a = 3"
		"let b = fn(a) {\n"
		"  let b = a\n"
		"}\n"
		"a = b(4)"
	);

	INS2(BC_SET_N, 0, 0);
	INS2(BC_SET_F, 1, 1);
	INS2(BC_SET_N, 2, 1);
	INS(BC_CALL, 1, 2, 1);
	INS2(BC_MOV, 0, 2);
	INS(BC_RET, 0, 0, 0);

	FN(1);
	INS2(BC_MOV, 1, 0);
	INS(BC_RET, 0, 0, 0);
}